

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testMethod_length(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  bool bVar3;
  int iVar4;
  String str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  String local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_length()\n",0x14);
  local_38.view_._M_len = 0;
  local_38.view_._M_str = (char *)0x0;
  local_38.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_38.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cm::String::operator=(&local_38,(char (*) [1])0x98e619);
  if (local_38.view_._M_len == 0) {
    cm::String::operator=(&local_38,(char (*) [4])"abc");
    if (local_38.view_._M_len == 3) {
      paVar1 = &local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)paVar1;
      cm::String::operator=(&local_38,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (local_38.view_._M_len == 0) {
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"abc","");
        cm::String::operator=(&local_38,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
        bVar3 = true;
        if (local_38.view_._M_len == 3) goto LAB_001c46ec;
        iVar4 = 0x24e;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.length() == 3) failed on line ",0x2e);
      }
      else {
        iVar4 = 0x24c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.length() == 0) failed on line ",0x2e);
      }
    }
    else {
      iVar4 = 0x24a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.length() == 3) failed on line ",0x2e);
    }
  }
  else {
    iVar4 = 0x248;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.length() == 0) failed on line ",0x2e);
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  bVar3 = false;
LAB_001c46ec:
  if (local_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar3;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}